

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_kernel_1.h
# Opt level: O2

bool __thiscall
dlib::
stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>
::move_next(stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>
            *this)

{
  node *pnVar1;
  
  if (this->_at_start == false) {
    if (this->current_element != (node *)0x0) {
      pnVar1 = this->current_element->next;
      this->current_element = pnVar1;
      return pnVar1 != (node *)0x0;
    }
  }
  else {
    this->_at_start = false;
    if (this->stack_size != 0) {
      this->current_element = this->top;
      return true;
    }
  }
  return false;
}

Assistant:

bool stack_kernel_1<T,mem_manager>::
    move_next (
    ) const
    {
        if (!_at_start)
        {
            if (current_element)
            {
                current_element = current_element->next;
                if (current_element)
                    return true;
                else
                    return false;
                }
            else
            {
                return false;
            }
        }
        else
        {
            _at_start = false;
            if (stack_size)
            {
                current_element = top;
                return true;
            }
            else
            {
                return false;
            }
        }
    }